

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall File::readAll(File *this,String *data)

{
  usize uVar1;
  char *pcVar2;
  void *__buf;
  size_t in_RCX;
  ssize dataCount;
  int64 fileSize;
  String *data_local;
  File *this_local;
  
  uVar1 = size(this);
  if ((long)uVar1 < 0) {
    this_local._7_1_ = false;
  }
  else {
    String::resize(data,uVar1);
    pcVar2 = String::operator_cast_to_char_(data);
    __buf = (void *)String::length(data);
    uVar1 = read(this,(int)pcVar2,__buf,in_RCX);
    if ((long)uVar1 < 0) {
      String::clear(data);
      this_local._7_1_ = false;
    }
    else {
      String::resize(data,uVar1);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool File::readAll(String& data)
{
  int64 fileSize = size();
  if(fileSize < 0)
    return false;
  data.resize((usize)fileSize);
  ssize dataCount = read((char*)data, data.length());
  if(dataCount < 0)
  {
    data.clear();
    return false;
  }
  data.resize(dataCount);
  return true;
}